

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-path.c
# Opt level: O3

void plutovg_path_line_to(plutovg_path_t *path,float x,float y)

{
  plutovg_path_element_t *ppVar1;
  
  if ((path->elements).size == 0) {
    ppVar1 = plutovg_path_add_command(path,PLUTOVG_PATH_COMMAND_MOVE_TO,1);
    *ppVar1 = (plutovg_path_element_t)0x0;
    (path->start_point).x = 0.0;
    (path->start_point).y = 0.0;
    path->num_contours = path->num_contours + 1;
  }
  ppVar1 = plutovg_path_add_command(path,PLUTOVG_PATH_COMMAND_LINE_TO,1);
  (ppVar1->point).x = x;
  (ppVar1->point).y = y;
  return;
}

Assistant:

void plutovg_path_line_to(plutovg_path_t* path, float x, float y)
{
    if(path->elements.size == 0)
        plutovg_path_move_to(path, 0, 0);
    plutovg_path_element_t* elements = plutovg_path_add_command(path, PLUTOVG_PATH_COMMAND_LINE_TO, 1);
    elements[0].point = PLUTOVG_MAKE_POINT(x, y);
}